

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getBleedBox
          (QPDFPageObjectHelper *this,bool copy_if_shared,bool copy_if_fallback)

{
  undefined1 in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  function<QPDFObjectHandle_()> *get_fallback;
  QPDFObjectHandle QVar1;
  allocator<char> local_69;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48 [32];
  
  get_fallback = (function<QPDFObjectHandle_()> *)
                 (CONCAT71(in_register_00000011,copy_if_fallback) & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/BleedBox",&local_69);
  local_68._M_pod_data[9] = in_CL;
  local_68._M_pod_data[8] = (char)get_fallback;
  local_68._10_6_ = 0;
  local_50 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:315:9)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:315:9)>
             ::_M_manager;
  local_68._M_unused._M_object = (string *)CONCAT71(in_register_00000031,copy_if_shared);
  getAttribute(this,(string *)CONCAT71(in_register_00000031,copy_if_shared),SUB81(local_48,0),
               get_fallback,SUB81(&local_68,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_48);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getBleedBox(bool copy_if_shared, bool copy_if_fallback)
{
    return getAttribute(
        "/BleedBox",
        copy_if_shared,
        [this, copy_if_shared, copy_if_fallback]() {
            return this->getCropBox(copy_if_shared, copy_if_fallback);
        },
        copy_if_fallback);
}